

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::IndexBufferTestInstance::IndexBufferTestInstance
          (IndexBufferTestInstance *this,Context *context,TestFlags flags)

{
  TestFlags flags_local;
  Context *context_local;
  IndexBufferTestInstance *this_local;
  
  DrawGridTestInstance::DrawGridTestInstance
            (&this->super_DrawGridTestInstance,context,flags,0x40,0x1800);
  (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
  super_SparseResourcesBaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__IndexBufferTestInstance_016b0338;
  (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.super_Delegate._vptr_Delegate =
       (_func_int **)&DAT_016b0370;
  this->m_halfVertexCount = 0x300;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferAlloc);
  return;
}

Assistant:

IndexBufferTestInstance (Context& context, const TestFlags flags)
		: DrawGridTestInstance	(context,
								 flags,
								 VK_BUFFER_USAGE_INDEX_BUFFER_BIT,
								 GRID_SIZE * GRID_SIZE * 6 * sizeof(deUint32))
		, m_halfVertexCount		(6 * (GRID_SIZE * GRID_SIZE) / 2)
	{
	}